

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

int BN_clear_bit(BIGNUM *a,int n)

{
  ulong *puVar1;
  uint uVar2;
  ulong *puVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = 0;
  if (-1 < n) {
    uVar2 = a->top;
    uVar6 = (ulong)uVar2;
    if ((int)((uint)n >> 6) < (int)uVar2) {
      bVar4 = (byte)n & 0x3f;
      puVar3 = a->d;
      puVar1 = puVar3 + ((uint)n >> 6);
      *puVar1 = *puVar1 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
      iVar5 = uVar2 + 1;
      do {
        if (puVar3[uVar6 - 1] != 0) goto LAB_00112bee;
        uVar6 = uVar6 - 1;
        iVar5 = iVar5 + -1;
      } while (1 < iVar5);
      uVar6 = 0;
LAB_00112bee:
      a->top = (int)uVar6;
      iVar5 = 1;
      if ((int)uVar6 == 0) {
        a->neg = 0;
        return iVar5;
      }
    }
  }
  return iVar5;
}

Assistant:

int BN_clear_bit(BIGNUM *a, int n)
{
    int i, j;

    bn_check_top(a);
    if (n < 0)
        return 0;

    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i)
        return (0);

    a->d[i] &= (~(((BN_ULONG)1) << j));
    bn_correct_top(a);
    return (1);
}